

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

u32 sqlite3FkOldmask(Parse *pParse,Table *pTab)

{
  int iVar1;
  HashElem *pHVar2;
  u32 uVar3;
  ulong uVar4;
  uint uVar5;
  long lVar6;
  FKey *pFVar7;
  long in_FS_OFFSET;
  Index *pIdx;
  Index *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = 0;
  if (((pParse->db->flags & 0x4000) != 0) && (uVar3 = 0, pTab->eTabType == '\0')) {
    uVar3 = 0;
    for (pFVar7 = (pTab->u).tab.pFKey; pFVar7 != (FKey *)0x0; pFVar7 = pFVar7->pNextFrom) {
      if (0 < (long)pFVar7->nCol) {
        lVar6 = 0;
        do {
          iVar1 = *(int *)((long)&pFVar7->aCol[0].iFrom + lVar6);
          uVar5 = 1 << ((byte)iVar1 & 0x1f);
          if (0x1f < iVar1) {
            uVar5 = 0xffffffff;
          }
          uVar3 = uVar3 | uVar5;
          lVar6 = lVar6 + 0x10;
        } while ((long)pFVar7->nCol * 0x10 != lVar6);
      }
    }
    pHVar2 = findElementWithHash(&pTab->pSchema->fkeyHash,pTab->zName,(uint *)0x0);
    pFVar7 = (FKey *)pHVar2->data;
    if (pFVar7 != (FKey *)0x0) {
      do {
        local_40 = (Index *)0x0;
        sqlite3FkLocateIndex(pParse,pTab,pFVar7,&local_40,(int **)0x0);
        if ((local_40 != (Index *)0x0) && ((ulong)local_40->nKeyCol != 0)) {
          uVar4 = 0;
          do {
            uVar5 = 1 << ((byte)local_40->aiColumn[uVar4] & 0x1f);
            if (0x1f < local_40->aiColumn[uVar4]) {
              uVar5 = 0xffffffff;
            }
            uVar3 = uVar3 | uVar5;
            uVar4 = uVar4 + 1;
          } while (local_40->nKeyCol != uVar4);
        }
        pFVar7 = pFVar7->pNextTo;
      } while (pFVar7 != (FKey *)0x0);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return uVar3;
  }
  __stack_chk_fail();
}

Assistant:

SQLITE_PRIVATE u32 sqlite3FkOldmask(
  Parse *pParse,                  /* Parse context */
  Table *pTab                     /* Table being modified */
){
  u32 mask = 0;
  if( pParse->db->flags&SQLITE_ForeignKeys && IsOrdinaryTable(pTab) ){
    FKey *p;
    int i;
    for(p=pTab->u.tab.pFKey; p; p=p->pNextFrom){
      for(i=0; i<p->nCol; i++) mask |= COLUMN_MASK(p->aCol[i].iFrom);
    }
    for(p=sqlite3FkReferences(pTab); p; p=p->pNextTo){
      Index *pIdx = 0;
      sqlite3FkLocateIndex(pParse, pTab, p, &pIdx, 0);
      if( pIdx ){
        for(i=0; i<pIdx->nKeyCol; i++){
          assert( pIdx->aiColumn[i]>=0 );
          mask |= COLUMN_MASK(pIdx->aiColumn[i]);
        }
      }
    }
  }
  return mask;
}